

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_response.hpp
# Opt level: O2

void __thiscall cinatra::coro_http_response::clear(coro_http_response *this)

{
  (this->content_)._M_string_length = 0;
  *(this->content_)._M_dataplus._M_p = '\0';
  if (this->need_shrink_every_time_ == true) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::shrink_to_fit
              (&this->content_);
  }
  std::vector<cinatra::resp_header,_std::allocator<cinatra::resp_header>_>::clear
            (&this->resp_headers_);
  (this->keepalive_).super__Optional_base<bool,_true,_true>._M_payload.
  super__Optional_payload_base<bool> = (_Optional_payload_base<bool>)0x0;
  this->delay_ = false;
  this->status_ = init;
  this->fmt_type_ = normal;
  (this->boundary_)._M_string_length = 0;
  *(this->boundary_)._M_dataplus._M_p = '\0';
  this->has_set_content_ = false;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cinatra::cookie>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cinatra::cookie>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(this->cookies_)._M_h);
  this->need_date_ = true;
  return;
}

Assistant:

void clear() {
    content_.clear();
    if (need_shrink_every_time_) {
      content_.shrink_to_fit();
    }

    resp_headers_.clear();
    keepalive_ = {};
    delay_ = false;
    status_ = status_type::init;
    fmt_type_ = format_type::normal;
    boundary_.clear();
    has_set_content_ = false;
    cookies_.clear();
    need_date_ = true;
  }